

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.cpp
# Opt level: O1

void __thiscall Material::Material(Material *this)

{
  undefined8 in_RAX;
  Color defColor;
  undefined8 uStack_18;
  
  (this->color).r = '0';
  (this->color).g = '0';
  (this->color).b = '0';
  *(undefined8 *)&(this->phong).field_0 = 0;
  *(undefined8 *)((long)&(this->phong).field_0 + 8) = 0;
  uStack_18 = in_RAX;
  Color::Color((Color *)((long)&uStack_18 + 4),0,0xff,0xff);
  Color::operator=(&this->color,uStack_18._4_3_);
  *(undefined8 *)&(this->phong).field_0 = 0;
  *(undefined8 *)((long)&(this->phong).field_0 + 8) = 0x3f80000000000000;
  *(undefined8 *)&this->phongExp = 0;
  *(undefined8 *)((long)&this->reflectance + 4) = 0;
  this->transmittance = 0.0;
  this->refraction = 0.0;
  return;
}

Assistant:

Material::Material() {
    Color defColor(0,255,255);
    color=defColor;
    this->phong={0,0,0,1};
    phongExp=0;
    reflectance=0;
    transmittance=0;
    refraction=0;
}